

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O0

ShaderProgramDeclaration *
deqp::gles31::Functional::FboTestUtil::genTexture2DShaderDecl
          (ShaderProgramDeclaration *__return_storage_ptr__,DataTypes *samplerTypes,
          DataType outputType)

{
  unsigned_long uVar1;
  GenericVecType type_;
  size_type sVar2;
  const_reference pvVar3;
  DataType in_ECX;
  string local_3b8;
  allocator<char> local_391;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  Uniform local_350;
  string local_328;
  allocator<char> local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  Uniform local_2c0;
  string local_298;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  Uniform local_230;
  unsigned_long local_208;
  size_t ndx;
  string local_1f8;
  Uniform local_1d8;
  allocator<char> local_1a9;
  string local_1a8;
  Uniform local_188;
  string local_160;
  FragmentSource local_140;
  allocator<char> local_119;
  string local_118;
  VertexSource local_f8;
  FragmentOutput local_d8;
  VertexToFragmentVarying local_d4;
  allocator<char> local_c9;
  string local_c8;
  VertexAttribute local_a8;
  allocator<char> local_69;
  string local_68;
  VertexAttribute local_48;
  undefined1 local_1d;
  DataType local_1c;
  FboTestUtil *pFStack_18;
  DataType outputType_local;
  DataTypes *samplerTypes_local;
  ShaderProgramDeclaration *decl;
  
  local_1d = 0;
  local_1c = outputType;
  pFStack_18 = (FboTestUtil *)samplerTypes;
  samplerTypes_local = (DataTypes *)__return_storage_ptr__;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"a_position",&local_69);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_48,&local_68,GENERICVECTYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_48);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"a_coord",&local_c9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_a8,&local_c8,GENERICVECTYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_a8);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying(&local_d4,GENERICVECTYPE_FLOAT,0);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_d4);
  type_ = mapDataTypeToGenericVecType(local_1c);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_d8,type_);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "#version 300 es\nin highp vec4 a_position;\nin highp vec2 a_coord;\nout highp vec2 v_coord;\nvoid main(void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_119);
  sglr::pdec::VertexSource::VertexSource(&local_f8,&local_118);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_f8);
  sglr::pdec::VertexSource::~VertexSource(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  genTexFragmentShader_abi_cxx11_
            (&local_160,pFStack_18,
             (vector<glu::DataType,_std::allocator<glu::DataType>_> *)(ulong)local_1c,in_ECX);
  sglr::pdec::FragmentSource::FragmentSource(&local_140,&local_160);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_140);
  sglr::pdec::FragmentSource::~FragmentSource(&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"u_outScale0",&local_1a9);
  sglr::pdec::Uniform::Uniform(&local_188,&local_1a8,TYPE_FLOAT_VEC4);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_188);
  sglr::pdec::Uniform::~Uniform(&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"u_outBias0",(allocator<char> *)((long)&ndx + 7));
  sglr::pdec::Uniform::Uniform(&local_1d8,&local_1f8,TYPE_FLOAT_VEC4);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_1d8);
  sglr::pdec::Uniform::~Uniform(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx + 7));
  for (local_208 = 0; uVar1 = local_208,
      sVar2 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::size
                        ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)pFStack_18),
      uVar1 < sVar2; local_208 = local_208 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"u_sampler",&local_271);
    de::toString<unsigned_long>(&local_298,&local_208);
    std::operator+(&local_250,&local_270,&local_298);
    pvVar3 = std::vector<glu::DataType,_std::allocator<glu::DataType>_>::operator[]
                       ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)pFStack_18,
                        local_208);
    sglr::pdec::Uniform::Uniform(&local_230,&local_250,*pvVar3);
    sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_230);
    sglr::pdec::Uniform::~Uniform(&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator(&local_271);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"u_texScale",&local_301)
    ;
    de::toString<unsigned_long>(&local_328,&local_208);
    std::operator+(&local_2e0,&local_300,&local_328);
    sglr::pdec::Uniform::Uniform(&local_2c0,&local_2e0,TYPE_FLOAT_VEC4);
    sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_2c0);
    sglr::pdec::Uniform::~Uniform(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"u_texBias",&local_391);
    de::toString<unsigned_long>(&local_3b8,&local_208);
    std::operator+(&local_370,&local_390,&local_3b8);
    sglr::pdec::Uniform::Uniform(&local_350,&local_370,TYPE_FLOAT_VEC4);
    sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_350);
    sglr::pdec::Uniform::~Uniform(&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_390);
    std::allocator<char>::~allocator(&local_391);
  }
  return __return_storage_ptr__;
}

Assistant:

static sglr::pdec::ShaderProgramDeclaration genTexture2DShaderDecl (const DataTypes& samplerTypes, glu::DataType outputType)
{
	sglr::pdec::ShaderProgramDeclaration decl;

	decl << sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType));

	decl << sglr::pdec::VertexSource(
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in highp vec2 a_coord;\n"
		"out highp vec2 v_coord;\n"
		"void main(void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coord = a_coord;\n"
		"}\n");
	decl << sglr::pdec::FragmentSource(genTexFragmentShader(samplerTypes.vec, outputType));

	decl << sglr::pdec::Uniform("u_outScale0", glu::TYPE_FLOAT_VEC4);
	decl << sglr::pdec::Uniform("u_outBias0", glu::TYPE_FLOAT_VEC4);

	for (size_t ndx = 0; ndx < samplerTypes.vec.size(); ++ndx)
	{
		decl << sglr::pdec::Uniform(std::string("u_sampler")  + de::toString(ndx), samplerTypes.vec[ndx]);
		decl << sglr::pdec::Uniform(std::string("u_texScale") + de::toString(ndx), glu::TYPE_FLOAT_VEC4);
		decl << sglr::pdec::Uniform(std::string("u_texBias")  + de::toString(ndx), glu::TYPE_FLOAT_VEC4);
	}

	return decl;
}